

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O1

void Kit_DsdPrintHex(FILE *pFile,uint *pTruth,int nFans)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  
  uVar2 = 1 << ((byte)nFans & 0x1f);
  if (3 < (int)uVar2) {
    iVar3 = (uVar2 >> 2) + 1;
    uVar2 = uVar2 & 0xfffffffc;
    do {
      uVar2 = uVar2 - 4;
      uVar1 = pTruth[iVar3 - 2U >> 3] >> ((byte)uVar2 & 0x1c) & 0xf;
      if (uVar1 < 10) {
        fprintf((FILE *)pFile,"%d");
      }
      else {
        fputc(uVar1 + 0x37,(FILE *)pFile);
      }
      iVar3 = iVar3 + -1;
    } while (1 < iVar3);
  }
  return;
}

Assistant:

void Kit_DsdPrintHex( FILE * pFile, unsigned * pTruth, int nFans )
{
    int nDigits, Digit, k;
    nDigits = (1 << nFans) / 4;
    for ( k = nDigits - 1; k >= 0; k-- )
    {
        Digit = ((pTruth[k/8] >> ((k%8) * 4)) & 15);
        if ( Digit < 10 )
            fprintf( pFile, "%d", Digit );
        else
            fprintf( pFile, "%c", 'A' + Digit-10 );
    }
}